

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O3

CTX_PTR CreateSuccessors(CPpmd8 *p,Bool skip,CPpmd_State *s1,CTX_PTR c)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  CPpmd_State *pCVar5;
  byte *pbVar6;
  CTX_PTR pCVar7;
  Byte *pBVar8;
  CPpmd_State *pCVar9;
  byte *pbVar10;
  ulong uVar11;
  char cVar12;
  uint uVar13;
  CPpmd_State **ppCVar14;
  int iVar15;
  ulong uVar16;
  CPpmd_State *ps [17];
  CPpmd_State *local_b8 [17];
  
  pCVar5 = p->FoundState;
  uVar4 = *(uint *)&pCVar5->SuccessorLow;
  if (skip == 0) {
    local_b8[0] = pCVar5;
  }
  uVar13 = c->Suffix;
  pBVar8 = p->Base;
  uVar16 = (ulong)(skip == 0);
  do {
    iVar15 = (int)uVar16;
    if (uVar13 == 0) {
LAB_00661c27:
      bVar1 = pCVar5->Symbol;
      bVar2 = pBVar8[uVar4];
      if (c->NumStats == 0) {
        cVar12 = *(char *)((long)&c->SummFreq + 1);
      }
      else {
        pbVar6 = pBVar8 + c->Stats;
        do {
          pbVar10 = pbVar6;
          pbVar6 = pbVar10 + 6;
        } while (*pbVar10 != bVar2);
        bVar3 = pbVar10[1];
        uVar13 = ((uint)c->SummFreq - ((uint)c->NumStats + (uint)bVar3)) + 1;
        if (uVar13 < (uint)bVar3 * 2 - 2) {
          cVar12 = (char)((((uint)bVar3 + uVar13 * 2) - 4) / uVar13);
        }
        else {
          cVar12 = uVar13 < (bVar3 - 1) * 5;
        }
        cVar12 = cVar12 + '\x01';
      }
      ppCVar14 = local_b8 + (iVar15 - 1);
      do {
        if (p->HiUnit == p->LoUnit) {
          uVar11 = (ulong)p->FreeList[0];
          if (uVar11 == 0) {
            pCVar7 = (CTX_PTR)AllocUnitsRare(p,0);
            if (pCVar7 == (CTX_PTR)0x0) {
              return (CTX_PTR)0x0;
            }
          }
          else {
            pCVar7 = (CTX_PTR)(pBVar8 + uVar11);
            p->FreeList[0] = *(CPpmd_Void_Ref *)(pBVar8 + uVar11 + 4);
            p->Stamps[0] = p->Stamps[0] - 1;
          }
        }
        else {
          pCVar7 = (CTX_PTR)(p->HiUnit + -0xc);
          p->HiUnit = (Byte *)pCVar7;
        }
        pCVar7->NumStats = '\0';
        pCVar7->Flags = (0x3f < bVar1) << 4 | (0x3f < bVar2) << 3;
        *(byte *)&pCVar7->SummFreq = bVar2;
        *(char *)((long)&pCVar7->SummFreq + 1) = cVar12;
        pCVar7->Stats = uVar4 + 1;
        pBVar8 = p->Base;
        pCVar7->Suffix = (int)c - (int)pBVar8;
        pCVar5 = *ppCVar14;
        ppCVar14 = ppCVar14 + -1;
        *(int *)&pCVar5->SuccessorLow = (int)pCVar7 - (int)pBVar8;
        uVar13 = (int)uVar16 - 1;
        uVar16 = (ulong)uVar13;
        c = pCVar7;
      } while (uVar13 != 0);
      return pCVar7;
    }
    c = (CTX_PTR)(pBVar8 + uVar13);
    if (s1 == (CPpmd_State *)0x0) {
      if (c->NumStats == '\0') {
        s1 = (CPpmd_State *)&c->SummFreq;
        bVar1 = *(byte *)((long)&c->SummFreq + 1);
        *(byte *)((long)&c->SummFreq + 1) = (bVar1 < 0x18 && pBVar8[c->Suffix] == '\0') + bVar1;
      }
      else {
        s1 = (CPpmd_State *)(pBVar8 + ((ulong)c->Stats - 6));
        do {
          pCVar9 = s1;
          s1 = pCVar9 + 1;
        } while ((Byte)*(CPpmd8_Context_Ref *)&pCVar9[1].Symbol != pCVar5->Symbol);
        if (pCVar9[1].Freq < 0x73) {
          pCVar9[1].Freq = pCVar9[1].Freq + 1;
          c->SummFreq = c->SummFreq + 1;
        }
      }
    }
    if (*(uint *)&s1->SuccessorLow != uVar4) {
      c = (CTX_PTR)(pBVar8 + *(uint *)&s1->SuccessorLow);
      if (iVar15 == 0) {
        return c;
      }
      goto LAB_00661c27;
    }
    local_b8[uVar16] = s1;
    uVar13 = c->Suffix;
    s1 = (CPpmd_State *)0x0;
    uVar16 = (ulong)(iVar15 + 1);
  } while( true );
}

Assistant:

static CTX_PTR CreateSuccessors(CPpmd8 *p, Bool skip, CPpmd_State *s1, CTX_PTR c)
{
  CPpmd_State upState;
  Byte flags;
  CPpmd_Byte_Ref upBranch = (CPpmd_Byte_Ref)SUCCESSOR(p->FoundState);
  /* fixed over Shkarin's code. Maybe it could work without + 1 too. */
  CPpmd_State *ps[PPMD8_MAX_ORDER + 1];
  unsigned numPs = 0;
  
  if (!skip)
    ps[numPs++] = p->FoundState;
  
  while (c->Suffix)
  {
    CPpmd_Void_Ref successor;
    CPpmd_State *s;
    c = SUFFIX(c);
    if (s1)
    {
      s = s1;
      s1 = NULL;
    }
    else if (c->NumStats != 0)
    {
      for (s = STATS(c); s->Symbol != p->FoundState->Symbol; s++);
      if (s->Freq < MAX_FREQ - 9)
      {
        s->Freq++;
        c->SummFreq++;
      }
    }
    else
    {
      s = ONE_STATE(c);
      s->Freq = (Byte)(s->Freq + (!SUFFIX(c)->NumStats & (s->Freq < 24)));
    }
    successor = SUCCESSOR(s);
    if (successor != upBranch)
    {
      c = CTX(successor);
      if (numPs == 0)
        return c;
      break;
    }
    ps[numPs++] = s;
  }
  
  upState.Symbol = *(const Byte *)Ppmd8_GetPtr(p, upBranch);
  SetSuccessor(&upState, upBranch + 1);
  flags = (Byte)(0x10 * (p->FoundState->Symbol >= 0x40) + 0x08 * (upState.Symbol >= 0x40));

  if (c->NumStats == 0)
    upState.Freq = ONE_STATE(c)->Freq;
  else
  {
    UInt32 cf, s0;
    CPpmd_State *s;
    for (s = STATS(c); s->Symbol != upState.Symbol; s++);
    cf = s->Freq - 1;
    s0 = c->SummFreq - c->NumStats - cf;
    upState.Freq = (Byte)(1 + ((2 * cf <= s0) ? (5 * cf > s0) : ((cf + 2 * s0 - 3) / s0)));
  }

  do
  {
    /* Create Child */
    CTX_PTR c1; /* = AllocContext(p); */
    if (p->HiUnit != p->LoUnit)
      c1 = (CTX_PTR)(p->HiUnit -= UNIT_SIZE);
    else if (p->FreeList[0] != 0)
      c1 = (CTX_PTR)RemoveNode(p, 0);
    else
    {
      c1 = (CTX_PTR)AllocUnitsRare(p, 0);
      if (!c1)
        return NULL;
    }
    c1->NumStats = 0;
    c1->Flags = flags;
    *ONE_STATE(c1) = upState;
    c1->Suffix = REF(c);
    SetSuccessor(ps[--numPs], REF(c1));
    c = c1;
  }
  while (numPs != 0);
  
  return c;
}